

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O0

void __thiscall
xmrig::HttpClient::HttpClient
          (HttpClient *this,int method,String *url,IHttpListener *listener,char *data,size_t size)

{
  char *pcVar1;
  void *pvVar2;
  String *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  char *in_R8;
  ulong in_R9;
  undefined4 in_stack_ffffffffffffff98;
  byte in_stack_ffffffffffffff9c;
  allocator in_stack_ffffffffffffff9d;
  byte in_stack_ffffffffffffff9e;
  allocator in_stack_ffffffffffffff9f;
  Dns *in_stack_ffffffffffffffa0;
  IHttpListener *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  HttpContext *in_stack_ffffffffffffffc0;
  
  HttpContext::HttpContext
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
  IDnsListener::IDnsListener((IDnsListener *)(in_RDI + 0x1d));
  *in_RDI = &PTR__HttpClient_002b7888;
  in_RDI[0x1d] = &PTR__HttpClient_002b78c8;
  *(undefined1 *)(in_RDI + 0x1e) = 0;
  *(undefined2 *)(in_RDI + 0x20) = 0;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  pcVar1 = String::operator_cast_to_char_(in_RDX);
  std::__cxx11::string::operator=((string *)(in_RDI + 0xc),pcVar1);
  if (in_R8 != (char *)0x0) {
    in_stack_ffffffffffffff9e = 0;
    in_stack_ffffffffffffff9c = 0;
    if (in_R9 == 0) {
      std::allocator<char>::allocator();
      in_stack_ffffffffffffff9c = 1;
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffa0,in_R8,(allocator *)&stack0xffffffffffffff9d);
    }
    else {
      std::allocator<char>::allocator();
      in_stack_ffffffffffffff9e = 1;
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffa0,in_R8,in_R9,
                 (allocator *)&stack0xffffffffffffff9f);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 8),(string *)&stack0xffffffffffffffa0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    if ((in_stack_ffffffffffffff9c & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9d);
    }
    if ((in_stack_ffffffffffffff9e & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
    }
  }
  pvVar2 = operator_new(0x90);
  Dns::Dns(in_stack_ffffffffffffffa0,
           (IDnsListener *)
           CONCAT17(in_stack_ffffffffffffff9f,
                    CONCAT16(in_stack_ffffffffffffff9e,
                             CONCAT15(in_stack_ffffffffffffff9d,
                                      CONCAT14(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
                            )));
  in_RDI[0x1f] = pvVar2;
  return;
}

Assistant:

xmrig::HttpClient::HttpClient(int method, const String &url, IHttpListener *listener, const char *data, size_t size) :
    HttpContext(HTTP_RESPONSE, listener)
{
    this->method = method;
    this->url    = url;

    if (data) {
        body = size ? std::string(data, size) : data;
    }

    m_dns = new Dns(this);
}